

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void __thiscall DCanvas::Dim(DCanvas *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  int iVar1;
  int iVar2;
  BYTE *pBVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  if ((damount != 0.0) || (NAN(damount))) {
    iVar2 = this->Width;
    if (iVar2 - x1 != 0 && x1 <= iVar2) {
      iVar1 = this->Height;
      if (iVar1 - y1 != 0 && y1 <= iVar1) {
        iVar4 = iVar2 - x1;
        if (w + x1 <= iVar2) {
          iVar4 = w;
        }
        iVar2 = iVar1 - y1;
        if (h + y1 <= iVar1) {
          iVar2 = h;
        }
        if (0 < iVar2 && 0 < iVar4) {
          iVar6 = (int)(damount * 64.0);
          iVar1 = this->Pitch;
          pBVar3 = this->Buffer + (long)(y1 * iVar1) + (long)x1;
          while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
            for (lVar5 = 0; iVar4 != (int)lVar5; lVar5 = lVar5 + 1) {
              uVar7 = Col2RGB8[0x40 - iVar6][pBVar3[lVar5]] +
                      (((uint)color.field_0 & 0xff) * 0x40 * iVar6 & 0xfffffc00 |
                      (int)(((uint)color.field_0 >> 8 & 0xff) * iVar6) >> 4 |
                      ((uint)color.field_0 & 0xff0000) * iVar6 & 0xfff00000) | 0x1f07c1f;
              pBVar3[lVar5] = RGB32k.All[uVar7 >> 0xf & uVar7];
            }
            pBVar3 = pBVar3 + lVar5 + (iVar1 - iVar4);
          }
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void DCanvas::Dim (PalEntry color, float damount, int x1, int y1, int w, int h)
{
	if (damount == 0.f)
		return;

	DWORD *bg2rgb;
	DWORD fg;
	int gap;
	BYTE *spot;
	int x, y;

	if (x1 >= Width || y1 >= Height)
	{
		return;
	}
	if (x1 + w > Width)
	{
		w = Width - x1;
	}
	if (y1 + h > Height)
	{
		h = Height - y1;
	}
	if (w <= 0 || h <= 0)
	{
		return;
	}

	{
		int amount;

		amount = (int)(damount * 64);
		bg2rgb = Col2RGB8[64-amount];

		fg = (((color.r * amount) >> 4) << 20) |
			  ((color.g * amount) >> 4) |
			 (((color.b * amount) >> 4) << 10);
	}

	spot = Buffer + x1 + y1*Pitch;
	gap = Pitch - w;
	for (y = h; y != 0; y--)
	{
		for (x = w; x != 0; x--)
		{
			DWORD bg;

			bg = bg2rgb[(*spot)&0xff];
			bg = (fg+bg) | 0x1f07c1f;
			*spot = RGB32k.All[bg&(bg>>15)];
			spot++;
		}
		spot += gap;
	}
}